

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t completed,size_t total)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  cmCTest *pcVar3;
  cmCTestTestProperties *pcVar4;
  pointer pbVar5;
  cmCTestRunTest *pcVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  ostream *poVar12;
  cmCTestTestProperties *pcVar13;
  time_point tVar14;
  long lVar15;
  string *psVar16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong *puVar19;
  char *pcVar20;
  char *pcVar21;
  pointer pbVar22;
  cmDuration testTimeOut;
  double dVar23;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string testName;
  ostringstream cmCTestLog_msg;
  ulong *local_1f8;
  char *local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  string local_1d8;
  string *local_1b8;
  cmCTestRunTest *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  char *local_180;
  ios_base local_138 [264];
  
  this->TotalNumberOfTests = total;
  bVar7 = cmCTest::GetTestProgressOutput(this->CTest);
  if (bVar7) {
    GetTestPrefix_abi_cxx11_(&local_1d8,this,completed,total);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1d8,
                                (ulong)(this->TestProperties->Name)._M_dataplus._M_p);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar18) {
      local_198._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_198._8_8_ = plVar9[3];
      local_1a8._0_8_ = &local_198;
    }
    else {
      local_198._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_1a8._8_8_ = plVar9[1];
    *plVar9 = (long)paVar18;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_1a8);
    puVar19 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar19) {
      local_1e8 = *puVar19;
      lStack_1e0 = plVar9[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *puVar19;
      local_1f8 = (ulong *)*plVar9;
    }
    local_1f0 = (char *)plVar9[1];
    *plVar9 = (long)puVar19;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_1f8,(long)local_1f0);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20f,local_1d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar10 = 10;
    if (9 < total) {
      uVar17 = 10;
      do {
        uVar17 = uVar17 + 2;
        bVar7 = 99 < total;
        total = total / 10;
      } while (bVar7);
      uVar10 = (ulong)uVar17;
    }
    *(ulong *)((long)&local_198 + *(size_type *)(local_1a8._0_8_ + -0x18)) = uVar10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start ",6);
    uVar10 = (ulong)this->TestHandler->MaxIndex;
    lVar15 = 1;
    if (9 < uVar10) {
      do {
        lVar15 = lVar15 + 1;
        bVar7 = 99 < uVar10;
        uVar10 = uVar10 / 10;
      } while (bVar7);
    }
    *(long *)((long)&local_198 + *(size_type *)(local_1a8._0_8_ + -0x18)) = lVar15;
    poVar12 = (ostream *)std::ostream::operator<<(local_1a8,this->TestProperties->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20b,(char *)local_1f8,false);
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  pcVar4 = this->TestProperties;
  (this->TestResult).Properties = pcVar4;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  (this->TestResult).TestCount = pcVar4->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  pcVar21 = (char *)(this->TestResult).CompletionStatus._M_string_length;
  psVar1 = &(this->TestResult).CompletionStatus;
  if (this->TestProperties->Disabled == true) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar21,0x744af6);
    (this->TestResult).Status = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).Output,0,
               (char *)(this->TestResult).Output._M_string_length,0x744af6);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    (this->TestResult).Environment._M_string_length = 0;
    *(this->TestResult).Environment._M_dataplus._M_p = '\0';
    return false;
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar21,0x749279);
  (this->TestResult).Status = 8;
  if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ComputeArguments(this);
    pcVar4 = this->TestProperties;
    pbVar22 = (pcVar4->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar13 = pcVar4;
    if (0x20 < (ulong)((long)(pcVar4->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar22)) {
      iVar8 = std::__cxx11::string::compare((char *)(pbVar22 + 1));
      if (iVar8 == 0) {
        local_1f0 = (char *)0x0;
        local_1e8 = local_1e8 & 0xffffffffffffff00;
        local_1f8 = &local_1e8;
        psVar16 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
        if (psVar16->_M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x7492bd);
        }
        else {
          psVar16 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
          local_198._8_8_ = (psVar16->_M_dataplus)._M_p;
          local_198._M_allocated_capacity = psVar16->_M_string_length;
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x25;
          local_1a8._8_8_ = "Test not available in configuration \"";
          local_188 = 2;
          local_180 = "\".";
          views._M_len = 3;
          views._M_array = (iterator)local_1a8;
          cmCatViews_abi_cxx11_(&local_1d8,views);
          std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
        }
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (this->TestHandler->LogFile,(char *)local_1f8,(long)local_1f0);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_1f8,(long)local_1f0);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x248,local_1d8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        (this->TestResult).Environment._M_string_length = 0;
        *(this->TestResult).Environment._M_dataplus._M_p = '\0';
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                   0x749327);
        (this->TestResult).Status = 0;
        if (local_1f8 != &local_1e8) goto LAB_00214bbe;
        goto LAB_00214bcb;
      }
      pcVar13 = this->TestProperties;
    }
    pbVar5 = (pcVar13->RequiredFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar22 = (pcVar13->RequiredFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar22 != pbVar5;
        pbVar22 = pbVar22 + 1) {
      bVar7 = cmsys::SystemTools::FileExists(pbVar22);
      if (!bVar7) {
        poVar12 = this->TestHandler->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"Unable to find required file: ",0x1e);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(pbVar22->_M_dataplus)._M_p,pbVar22->_M_string_length);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unable to find required file: ",0x1e);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pbVar22->_M_dataplus)._M_p,
                             pbVar22->_M_string_length);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,600,(char *)local_1f8,false);
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,local_1e8 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"Unable to find required file: ",pbVar22);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        (this->TestResult).Environment._M_string_length = 0;
        *(this->TestResult).Environment._M_dataplus._M_p = '\0';
        pcVar21 = (char *)(this->TestResult).CompletionStatus._M_string_length;
        pcVar20 = "Required Files Missing";
        goto LAB_00215057;
      }
    }
    if ((this->ActualCommand)._M_string_length == 0) {
      poVar12 = this->TestHandler->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Unable to find executable: ",0x1b)
      ;
      pbVar22 = (pcVar4->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,pbVar22[1]._M_dataplus._M_p,pbVar22[1]._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unable to find executable: ",0x1b);
      pbVar22 = (pcVar4->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pbVar22[1]._M_dataplus._M_p,
                           pbVar22[1]._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x268,(char *)local_1f8,false);
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Unable to find executable: ",
                     (pcVar4->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      (this->TestResult).FullCommandLine._M_string_length = 0;
      *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
      (this->TestResult).Environment._M_string_length = 0;
      *(this->TestResult).Environment._M_dataplus._M_p = '\0';
      pcVar21 = (char *)(this->TestResult).CompletionStatus._M_string_length;
      pcVar20 = "Unable to find executable";
LAB_00215057:
      bVar7 = false;
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar21,(ulong)pcVar20);
      (this->TestResult).Status = 0;
    }
    else {
      cmCTest::CurrentTime_abi_cxx11_((string *)local_1a8,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      local_1b8 = (string *)(this->TestProperties->Timeout).__r;
      this->TimeoutIsForStopTime = false;
      tVar14 = cmCTest::GetStopTime(this->CTest);
      testTimeOut.__r = (rep_conflict)local_1b8;
      if (tVar14.__d.__r != 0) {
        lVar15 = std::chrono::_V2::system_clock::now();
        dVar23 = (double)(((long)tVar14.__d.__r - lVar15) % 86400000000000) / 1000000000.0;
        if (dVar23 <= 0.0) {
          dVar23 = 0.0;
        }
        if ((((double)local_1b8 == 0.0) && (!NAN((double)local_1b8))) ||
           (testTimeOut.__r = (rep_conflict)local_1b8, dVar23 < (double)local_1b8)) {
          this->TimeoutIsForStopTime = true;
          testTimeOut.__r = dVar23;
        }
      }
      pcVar4 = this->TestProperties;
      bVar7 = ForkProcess(this,testTimeOut,pcVar4->ExplicitTimeout,&pcVar4->Environment,
                          &pcVar4->EnvironmentModification,&pcVar4->Affinity);
    }
  }
  else {
    local_1f8 = &local_1e8;
    local_1b8 = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"Failed test dependencies:","");
    p_Var11 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
    local_1b0 = this;
    if ((_Rb_tree_header *)p_Var11 != p_Var2) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
        std::__cxx11::string::_M_append((char *)&local_1f8,local_1a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var2);
    }
    pcVar6 = local_1b0;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1b0->TestHandler->LogFile,(char *)local_1f8,(long)local_1f0);
    psVar1 = local_1b8;
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_1f8,(long)local_1f0);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar3 = pcVar6->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x233,local_1d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(pcVar6->TestResult).Output);
    (pcVar6->TestResult).FullCommandLine._M_string_length = 0;
    *(pcVar6->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    (pcVar6->TestResult).Environment._M_string_length = 0;
    *(pcVar6->TestResult).Environment._M_dataplus._M_p = '\0';
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(pcVar6->TestResult).CompletionStatus._M_string_length,
               0x7492a3);
    (pcVar6->TestResult).Status = 0;
    if (local_1f8 != &local_1e8) {
LAB_00214bbe:
      operator_delete(local_1f8,local_1e8 + 1);
    }
LAB_00214bcb:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t completed, size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(total) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  } else {
    std::string testName = this->GetTestPrefix(completed, total) +
      this->TestProperties->Name + "\n";
    cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
  }

  this->ProcessOutput.clear();

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    return false;
  }

  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;

  // Check for failed fixture dependencies before we even look at the command
  // arguments because if we are not going to run the test, the command and
  // its arguments are irrelevant. This matters for the case where a fixture
  // dependency might be creating the executable we want to run.
  if (!this->FailedDependencies.empty()) {
    std::string msg = "Failed test dependencies:";
    for (std::string const& failedDep : this->FailedDependencies) {
      msg += " " + failedDep;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.  (Missing \"-C "
            "<config>\"?)";
    } else {
      msg = cmStrCat("Test not available in configuration \"",
                     this->CTest->GetConfigType(), "\".");
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::string const& file : this->TestProperties->RequiredFiles) {
    if (!cmSystemTools::FileExists(file)) {
      // Required file was not found
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine.clear();
      this->TestResult.Environment.clear();
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand.empty()) {
    // if the command was not found create a TestResult object
    // that has that information
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  auto timeout = this->TestProperties->Timeout;

  this->TimeoutIsForStopTime = false;
  std::chrono::system_clock::time_point stop_time = this->CTest->GetStopTime();
  if (stop_time != std::chrono::system_clock::time_point()) {
    std::chrono::duration<double> stop_timeout =
      (stop_time - std::chrono::system_clock::now()) % std::chrono::hours(24);

    if (stop_timeout <= std::chrono::duration<double>::zero()) {
      stop_timeout = std::chrono::duration<double>::zero();
    }
    if (timeout == std::chrono::duration<double>::zero() ||
        stop_timeout < timeout) {
      this->TimeoutIsForStopTime = true;
      timeout = stop_timeout;
    }
  }

  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment,
                           &this->TestProperties->EnvironmentModification,
                           &this->TestProperties->Affinity);
}